

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_failurecount_assertion.hpp
# Opt level: O3

AssertionResult * __thiscall
iutest::detail::StatementsFailureCount::GetResult
          (AssertionResult *__return_storage_ptr__,StatementsFailureCount *this,size_t cnt,
          char *stetements_str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pcVar5;
  TestFlag *pTVar6;
  AssertionResult *pAVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  AssertionResult *ar;
  ulong local_70;
  char *local_68;
  size_t local_60;
  AssertionResult local_58;
  
  pTVar3 = (this->super_Collector<iutest::detail::NoTestPartResultReporter>).m_results.
           super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar4 = (this->super_Collector<iutest::detail::NoTestPartResultReporter>).m_results.
           super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar8 = ((long)pTVar4 - (long)pTVar3 >> 4) * -0x5555555555555555;
  local_68 = stetements_str;
  local_60 = cnt;
  if (pTVar4 == pTVar3) {
    uVar9 = 0;
  }
  else {
    lVar10 = lVar8 + (ulong)(lVar8 == 0);
    lVar11 = 0x2c;
    uVar9 = 0;
    do {
      iVar2 = *(int *)((long)&(((this->super_Collector<iutest::detail::NoTestPartResultReporter>).
                                m_results.
                                super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                ._M_impl.super__Vector_impl_data._M_start)->super_iuCodeMessage).
                              m_message._M_dataplus + lVar11);
      pTVar6 = TestFlag::GetInstance();
      uVar9 = uVar9 + (byte)(0 < iVar2 | iVar2 == -1 & (byte)pTVar6->m_test_flags >> 7);
      lVar11 = lVar11 + 0x30;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  if (uVar9 < cnt) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    paVar1 = &local_58.m_message.field_2;
    local_58.m_message._M_string_length = 0;
    local_58.m_message.field_2._M_local_buf[0] = '\0';
    local_58.m_result = false;
    local_70 = uVar9;
    local_58.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar7 = AssertionResult::operator<<(&local_58,&local_68);
    pAVar7 = AssertionResult::operator<<
                       (pAVar7,(char (*) [36])"\nExpected: failure count less than ");
    pAVar7 = AssertionResult::operator<<(pAVar7,&local_60);
    pAVar7 = AssertionResult::operator<<(pAVar7,(char (*) [12])"\n  Actual: ");
    pAVar7 = AssertionResult::operator<<(pAVar7,&local_70);
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar5 = (pAVar7->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar5,pcVar5 + (pAVar7->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar7->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.m_message._M_dataplus._M_p,
                      CONCAT71(local_58.m_message.field_2._M_allocated_capacity._1_7_,
                               local_58.m_message.field_2._M_local_buf[0]) + 1);
    }
    AssertionResult::operator<<(__return_storage_ptr__,(char (*) [19])"\nReported results:");
    if (pTVar4 != pTVar3) {
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      lVar10 = 0;
      do {
        pAVar7 = AssertionResult::operator<<(__return_storage_ptr__,(char (*) [2])0x133293);
        local_58.m_message._M_dataplus._M_p =
             *(pointer *)
              ((long)&(((this->super_Collector<iutest::detail::NoTestPartResultReporter>).m_results.
                        super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                        ._M_impl.super__Vector_impl_data._M_start)->super_iuCodeMessage).m_message.
                      _M_dataplus + lVar10);
        AssertionResult::operator<<(pAVar7,(char **)&local_58);
        lVar10 = lVar10 + 0x30;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult GetResult(size_t cnt, const char* stetements_str)
    {
        const size_t num = count();
        size_t n=0;
        for( size_t i=0; i < num; ++i )
        {
            if( GetTestPartResult(i).failed() )
            {
                ++n;
            }
        }
        if( n < cnt )
        {
            return AssertionSuccess();
        }
        AssertionResult ar = AssertionFailure() << stetements_str << "\nExpected: failure count less than " << cnt << "\n  Actual: " << n;
        ar << "\nReported results:";
        for( size_t i=0; i < num; ++i )
        {
            ar << "\n" << GetTestPartResult(i).message();
        }
        return ar;
    }